

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall FlowGraph::DoesExitLabelDominate(FlowGraph *this,BranchInstr *leaveInstr)

{
  code *pcVar1;
  bool bVar2;
  LabelInstr *pLVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  Region *region1;
  Type *ppLVar6;
  Region *region2;
  LabelInstr *exitLabel;
  LabelInstr *nextLabel;
  BranchInstr *leaveChain;
  LabelInstr *leaveTarget;
  BranchInstr *leaveInstr_local;
  FlowGraph *this_local;
  
  pLVar3 = IR::BranchInstr::GetTarget(leaveInstr);
  pIVar4 = IR::Instr::GetNextRealInstr(&pLVar3->super_Instr);
  bVar2 = IR::Instr::IsBranchInstr(pIVar4);
  if ((!bVar2) &&
     (pIVar4 = IR::Instr::GetNextRealInstr(&pLVar3->super_Instr),
     pIVar4->m_opcode != ProfiledLoopEnd)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x55,
                       "(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd)"
                       ,
                       "leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar4 = IR::Instr::GetNextBranchOrLabel(&pLVar3->super_Instr);
  nextLabel = (LabelInstr *)IR::Instr::AsBranchInstr(pIVar4);
  do {
    if ((nextLabel->super_Instr).m_opcode == Br) {
LAB_0052a5b0:
      pLVar3 = IR::BranchInstr::GetTarget((BranchInstr *)nextLabel);
      region1 = IR::LabelInstr::GetRegion(pLVar3);
      ppLVar6 = SList<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>::Top
                          (this->finallyLabelStack);
      region2 = IR::LabelInstr::GetRegion(*ppLVar6);
      bVar2 = Dominates(this,region1,region2);
      return bVar2;
    }
    if (((nextLabel->super_Instr).m_opcode != Leave) &&
       ((nextLabel->super_Instr).m_opcode != BrOnException)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x5a,
                         "(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException)"
                         ,
                         "leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pLVar3 = IR::Instr::AsLabelInstr((nextLabel->super_Instr).m_next);
    bVar2 = IR::Instr::IsBranchInstr((pLVar3->super_Instr).m_next);
    if (!bVar2) {
      if (((pLVar3->super_Instr).m_next)->m_opcode != ProfiledLoopEnd) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x5f,"(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd)",
                           "nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      goto LAB_0052a5b0;
    }
    nextLabel = (LabelInstr *)IR::Instr::AsBranchInstr((pLVar3->super_Instr).m_next);
  } while( true );
}

Assistant:

bool FlowGraph::DoesExitLabelDominate(IR::BranchInstr *leaveInstr)
{
    IR::LabelInstr * leaveTarget = leaveInstr->GetTarget();
    Assert(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd);
    IR::BranchInstr *leaveChain = leaveTarget->GetNextBranchOrLabel()->AsBranchInstr();

    while (leaveChain->m_opcode != Js::OpCode::Br)
    {
        Assert(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException);
        IR::LabelInstr * nextLabel = leaveChain->m_next->AsLabelInstr();
        if (!nextLabel->m_next->IsBranchInstr())
        {
            // For jit loop bodies - we can encounter ProfiledLoopEnd before every early return
            Assert(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd);
            break;
        }
        leaveChain = nextLabel->m_next->AsBranchInstr();
    }
    IR::LabelInstr * exitLabel = leaveChain->GetTarget();
    return Dominates(exitLabel->GetRegion(), finallyLabelStack->Top()->GetRegion());
}